

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_test.hpp
# Opt level: O2

void __thiscall
test_impl::
R<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::oops<int>(R<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *this,int *u)

{
  ostream *poVar1;
  __ostream_type *p_Var2;
  streamable<int> local_20;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"> ERROR: CHECK failed \"");
  poVar1 = std::operator<<(poVar1,this->expr_);
  poVar1 = std::operator<<(poVar1,"\"\n");
  poVar1 = std::operator<<(poVar1,"> \t");
  poVar1 = std::operator<<(poVar1,this->filename_);
  poVar1 = std::operator<<(poVar1,'(');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->lineno_);
  poVar1 = std::operator<<(poVar1,')');
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"> \t in function \"");
  poVar1 = std::operator<<(poVar1,this->func_);
  std::operator<<(poVar1,"\"\n");
  if (this->dismissed_ == true) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"> \tEXPECTED: ");
    local_20.t_ = u;
    p_Var2 = ({parm#1}<<((std::declval<std::remove_reference<int>::type_const&>)()))test_impl::
             operator<<(poVar1,&local_20);
    poVar1 = std::operator<<(p_Var2,"\n> \tACTUAL: ");
    poVar1 = std::operator<<(poVar1,"<non-streamable type>");
    std::operator<<(poVar1,'\n');
  }
  test_failures()::test_failures = test_failures()::test_failures + 1;
  return;
}

Assistant:

void oops(U const &u) const
        {
            std::cerr
                << "> ERROR: CHECK failed \"" << expr_ << "\"\n"
                << "> \t" << filename_ << '(' << lineno_ << ')' << '\n'
                << "> \t in function \"" << func_ << "\"\n";
            if(dismissed_)
                std::cerr
                    << "> \tEXPECTED: " << stream(u) << "\n> \tACTUAL: " << stream(t_) << '\n';
            ++test_failures();
        }